

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

Vec_Wrd_t * Vec_WrdDup(Vec_Wrd_t *pVec)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *__dest;
  size_t __size;
  
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar1 = pVec->nSize;
  pVVar2->nSize = iVar1;
  pVVar2->nCap = iVar1;
  if ((long)iVar1 == 0) {
    __size = 0;
    __dest = (word *)0x0;
  }
  else {
    __size = (long)iVar1 << 3;
    __dest = (word *)malloc(__size);
  }
  pVVar2->pArray = __dest;
  memcpy(__dest,pVec->pArray,__size);
  return pVVar2;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdDup( Vec_Wrd_t * pVec )
{
    Vec_Wrd_t * p;
    p = ABC_ALLOC( Vec_Wrd_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nSize;
    p->pArray = p->nCap? ABC_ALLOC( word, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(word) * pVec->nSize );
    return p;
}